

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_helper<void(*)(std::shared_ptr<std::ostream>&,cs_impl::any_const&),void(*)(std::shared_ptr<std::ostream>&,cs_impl::any_const&)>
::_call<0,1>(cni_helper<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_const_cs_impl::any_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_const_cs_impl::any_&)>
             *this,vector *args,sequence<0,_1> *param_3)

{
  shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *__args_1;
  reference val;
  shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *in_RDX;
  function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_const_cs_impl::any_&)>
  *in_RSI;
  var *in_stack_00000100;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RSI,0);
  __args_1 = try_convert_and_check<std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>,_0UL>
             ::convert(in_stack_00000100);
  val = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[]
                  ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RSI,1);
  try_convert_and_check<const_cs_impl::any_&,_const_cs_impl::any_&,_cs_impl::any,_1UL>::convert(val)
  ;
  std::
  function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_const_cs_impl::any_&)>
  ::operator()(in_RSI,in_RDX,(any *)__args_1);
  return;
}

Assistant:

void _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...);
		}